

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
booster::locale::basic_format<wchar_t>::format_output
          (basic_format<wchar_t> *this,stream_type *out,string_type *sformat)

{
  size_t sVar1;
  ulong uVar2;
  long lVar3;
  bool bVar4;
  undefined1 local_108 [28];
  uint position;
  int local_e8;
  char_type_conflict c_1;
  char_type_conflict c;
  bool use_svalue;
  string_type value;
  string svalue;
  string key;
  undefined1 local_70 [8];
  format_guard guard;
  format_parser fmt;
  wchar_t *format;
  size_t size;
  size_t pos;
  char_type_conflict quote;
  char_type_conflict comma;
  char_type_conflict eq;
  char_type_conflict cbrk;
  char_type_conflict obrk;
  string_type *sformat_local;
  stream_type *out_local;
  basic_format<wchar_t> *this_local;
  
  size = 0;
  uVar2 = std::__cxx11::wstring::size();
  lVar3 = std::__cxx11::wstring::c_str();
  do {
    while( true ) {
      while( true ) {
        if (*(int *)(lVar3 + size * 4) == 0) {
          return;
        }
        if (*(int *)(lVar3 + size * 4) == 0x7b) break;
        if ((*(int *)(lVar3 + size * 4) == 0x7d) && (*(int *)(lVar3 + 4 + size * 4) == 0x7d)) {
          std::operator<<((wostream *)out,L'}');
          size = size + 2;
        }
        else {
          std::operator<<((wostream *)out,*(wchar_t *)(lVar3 + size * 4));
          size = size + 1;
        }
      }
      if ((uVar2 <= size + 1) || (*(int *)(lVar3 + 4 + size * 4) != 0x7b)) break;
      std::operator<<((wostream *)out,L'{');
      size = size + 2;
    }
    size = size + 1;
    booster::locale::details::format_parser::format_parser
              ((format_parser *)&guard.restored_,(ios_base *)(out + *(long *)(*(long *)out + -0x18))
               ,out,imbue_locale);
    format_guard::format_guard((format_guard *)local_70,(format_parser *)&guard.restored_);
    do {
      if (uVar2 <= size) break;
      std::__cxx11::string::string((string *)(svalue.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)((long)&value.field_2 + 8));
      std::__cxx11::wstring::wstring((wstring *)&c);
      c_1._3_1_ = 1;
      for (; (((*(int *)(lVar3 + size * 4) != 0 &&
               (local_e8 = *(int *)(lVar3 + size * 4), local_e8 != 0x2c)) && (local_e8 != 0x3d)) &&
             (local_e8 != 0x7d)); size = size + 1) {
        std::__cxx11::string::operator+=
                  ((string *)(svalue.field_2._M_local_buf + 8),(char)local_e8._0_1_);
      }
      if (*(int *)(lVar3 + size * 4) == 0x3d) {
        sVar1 = size + 1;
        if (*(int *)(lVar3 + (size + 1) * 4) == 0x27) {
          size = size + 2;
          c_1._3_1_ = 0;
          while (*(int *)(lVar3 + size * 4) != 0) {
            if (*(int *)(lVar3 + size * 4) == 0x27) {
              if (*(int *)(lVar3 + 4 + size * 4) != 0x27) {
                size = size + 1;
                break;
              }
              std::__cxx11::wstring::operator+=((wstring *)&c,L'\'');
              size = size + 2;
            }
            else {
              std::__cxx11::wstring::operator+=((wstring *)&c,*(wchar_t *)(lVar3 + size * 4));
              size = size + 1;
            }
          }
        }
        else {
          while( true ) {
            size = sVar1;
            position = *(uint *)(lVar3 + size * 4);
            bVar4 = false;
            if ((position != 0) && (bVar4 = false, position != 0x2c)) {
              bVar4 = position != 0x7d;
            }
            if (!bVar4) break;
            std::__cxx11::string::operator+=((string *)((long)&value.field_2 + 8),(char)position);
            sVar1 = size + 1;
          }
        }
      }
      if ((c_1._3_1_ & 1) == 0) {
        details::format_parser::set_flag_with_str<wchar_t>
                  ((format_parser *)&guard.restored_,(string *)((long)&svalue.field_2 + 8),
                   (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)&c)
        ;
      }
      else {
        booster::locale::details::format_parser::set_one_flag
                  ((string *)&guard.restored_,(string *)(svalue.field_2._M_local_buf + 8));
      }
      if (*(int *)(lVar3 + size * 4) == 0x2c) {
        size = size + 1;
        local_108._24_4_ = 4;
      }
      else if (*(int *)(lVar3 + size * 4) == 0x7d) {
        local_108._20_4_ = booster::locale::details::format_parser::get_position();
        get((basic_format<wchar_t> *)local_108,(uint)this);
        details::operator<<((stream_type *)out,(formattible<wchar_t> *)local_108);
        format_guard::restore((format_guard *)local_70);
        size = size + 1;
        local_108._24_4_ = 5;
      }
      else {
        format_guard::restore((format_guard *)local_70);
        local_108._24_4_ = 5;
      }
      std::__cxx11::wstring::~wstring((wstring *)&c);
      std::__cxx11::string::~string((string *)((long)&value.field_2 + 8));
      std::__cxx11::string::~string((string *)(svalue.field_2._M_local_buf + 8));
    } while (local_108._24_4_ == 4);
    format_guard::~format_guard((format_guard *)local_70);
    booster::locale::details::format_parser::~format_parser((format_parser *)&guard.restored_);
  } while( true );
}

Assistant:

void format_output(stream_type &out,string_type const &sformat) const
            {
                char_type obrk='{';
                char_type cbrk='}';
                char_type eq='=';
                char_type comma=',';
                char_type quote='\'';

                size_t pos = 0;
                size_t size=sformat.size();
                CharType const *format=sformat.c_str();
                while(format[pos]!=0) {
                    if(format[pos] != obrk) {
                        if(format[pos]==cbrk && format[pos+1]==cbrk) {
                            out << cbrk;
                            pos+=2;
                        }
                        else {
                            out<<format[pos];
                            pos++;
                        }
                        continue;
                    }

                    if(pos+1 < size && format[pos+1]==obrk) {
                        out << obrk;
                        pos+=2;
                        continue;
                    }
                    pos++;
                  
                    details::format_parser fmt(out,static_cast<void *>(&out),&basic_format::imbue_locale);

                    format_guard guard(fmt);

                    while(pos < size) { 
                        std::string key;
                        std::string svalue;
                        string_type value;
                        bool use_svalue = true;
                        for(;format[pos];pos++) {
                            char_type c=format[pos];
                            if(c==comma || c==eq || c==cbrk)
                                break;
                            else {
                                key+=static_cast<char>(c);
                            }
                        }

                        if(format[pos]==eq) {
                            pos++;
                            if(format[pos]==quote) {
                                pos++;
                                use_svalue = false;
                                while(format[pos]) {
                                    if(format[pos]==quote) {
                                        if(format[pos+1]==quote) {
                                            value+=quote;
                                            pos+=2;
                                        }
                                        else {
                                            pos++;
                                            break;
                                        }
                                    }
                                    else {
                                        value+=format[pos];
                                        pos++;
                                    }
                                }
                            }
                            else {
                                char_type c;
                                while((c=format[pos])!=0 && c!=comma && c!=cbrk) {
                                    svalue+=static_cast<char>(c);
                                    pos++;
                                }
                            }
                        }

                        if(use_svalue) {
                            fmt.set_one_flag(key,svalue);
                        }
                        else 
                            fmt.set_flag_with_str(key,value);
                        
                        if(format[pos]==comma) {
                            pos++;
                            continue;
                        }
                        else if(format[pos]==cbrk)  {
                            unsigned position = fmt.get_position();
                            out << get(position);
                            guard.restore();
                            pos++;
                            break;
                        }
                        else {                        
                            guard.restore();
                            break;
                        }
                    }
                }
            }